

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::ParseableFunctionInfo::SetIsNonUserCode(ParseableFunctionInfo *this,bool set)

{
  NestedArray *pNVar1;
  ParseableFunctionInfo *this_00;
  uint i;
  ulong uVar2;
  
  this->flags = set << 4 |
                this->flags &
                (Flags_HasRestParameter|Flags_HasNoExplicitReturnValue|Flags_HasOnlyThisStatements|
                 Flags_HasThis|Flags_HasTry|Flags_HasOrParentHasArguments|Flags_StackNestedFunc);
  pNVar1 = (this->nestedArray).ptr;
  if (pNVar1 != (NestedArray *)0x0) {
    for (uVar2 = 0; uVar2 < pNVar1->nestedCount; uVar2 = uVar2 + 1) {
      this_00 = FunctionProxy::GetParseableFunctionInfo
                          (*(FunctionProxy **)((long)pNVar1[uVar2 + 1] + 8));
      if (this_00 != (ParseableFunctionInfo *)0x0) {
        SetIsNonUserCode(this_00,set);
      }
    }
  }
  return;
}

Assistant:

void ParseableFunctionInfo::SetIsNonUserCode(bool set)
    {
        // Mark current function as a non-user code, so that we can distinguish cases where exceptions are
        // caught in non-user code (see ProbeContainer::HasAllowedForException).
        SetFlags(set, Flags_NonUserCode);

        // Propagate setting for all functions in this scope (nested).
        this->ForEachNestedFunc([&](FunctionProxy* proxy, uint32 index)
        {
            ParseableFunctionInfo * pBody = proxy->GetParseableFunctionInfo();
            if (pBody != nullptr)
            {
                pBody->SetIsNonUserCode(set);
            }
            return true;
        });
    }